

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint *puVar19;
  long lVar20;
  long lVar21;
  ArgExc *this;
  ulong uVar22;
  _Rb_tree_node_base *local_80;
  
  if ((((*(int *)(level1 + 0x18) == *(int *)(level2 + 0x18) - dx) &&
       (*(int *)(level1 + 0x1c) == *(int *)(level2 + 0x1c) - dy)) &&
      (*(int *)(level1 + 0x20) == *(int *)(level2 + 0x20) - dx)) &&
     (*(int *)(level1 + 0x24) == *(int *)(level2 + 0x24) - dy)) {
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::begin();
    for (local_80 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::begin();
        (p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end(), p_Var12 != p_Var13 &&
        (p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end(), local_80 != p_Var13));
        local_80 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_80)) {
      poVar14 = std::operator<<((ostream *)&std::cout,"            channel ");
      poVar14 = std::operator<<(poVar14,(string *)(p_Var12 + 1));
      std::endl<char,std::char_traits<char>>(poVar14);
      bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var12 + 1),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_80 + 1));
      if (bVar9) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel names");
        goto LAB_0010c4c8;
      }
      iVar10 = (**(code **)**(undefined8 **)(p_Var12 + 2))();
      iVar11 = (**(code **)**(undefined8 **)(local_80 + 2))();
      if (iVar10 != iVar11) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel types");
        goto LAB_0010c4c8;
      }
      puVar6 = *(undefined8 **)(p_Var12 + 2);
      lVar7 = *(long *)(local_80 + 2);
      if ((*(int *)(puVar6 + 2) != *(int *)(lVar7 + 0x10)) ||
         (*(int *)((long)puVar6 + 0x14) != *(int *)(lVar7 + 0x14))) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel sampling rates");
        goto LAB_0010c4c8;
      }
      if (*(char *)(puVar6 + 3) != *(char *)(lVar7 + 0x18)) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this,"different channel types");
        goto LAB_0010c4c8;
      }
      iVar10 = (**(code **)*puVar6)();
      if (iVar10 == 0) {
        lVar7 = *(long *)(p_Var12 + 2);
        uVar8 = *(undefined8 *)(local_80 + 2);
        lVar15 = __dynamic_cast(lVar7,&Imf_3_2::DeepImageChannel::typeinfo,
                                &Imf_3_2::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
        if ((lVar15 == 0) ||
           (lVar16 = __dynamic_cast(uVar8,&Imf_3_2::DeepImageChannel::typeinfo,
                                    &Imf_3_2::TypedDeepImageChannel<unsigned_int>::typeinfo,0),
           lVar16 == 0)) {
LAB_0010c532:
          __cxa_bad_cast();
        }
        lVar7 = *(long *)(lVar7 + 8);
        lVar17 = Imf_3_2::DeepImageChannel::deepLevel();
        lVar18 = Imf_3_2::DeepImageChannel::deepLevel();
        for (iVar10 = *(int *)(lVar7 + 0x1c); iVar10 <= *(int *)(lVar7 + 0x24); iVar10 = iVar10 + 1)
        {
          for (iVar11 = *(int *)(lVar7 + 0x18); iVar11 <= *(int *)(lVar7 + 0x20);
              iVar11 = iVar11 + 1) {
            puVar19 = Imf_3_2::SampleCountChannel::at
                                ((SampleCountChannel *)(lVar17 + 0x58),iVar11,iVar10);
            uVar5 = *puVar19;
            puVar19 = Imf_3_2::SampleCountChannel::at
                                ((SampleCountChannel *)(lVar18 + 0x58),iVar11 + dx,iVar10 + dy);
            if (uVar5 != *puVar19) {
              this = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(this,"different pixel sample counts");
              goto LAB_0010c4c8;
            }
            lVar20 = Imf_3_2::TypedDeepImageChannel<unsigned_int>::at((int)lVar15,iVar11);
            lVar21 = Imf_3_2::TypedDeepImageChannel<unsigned_int>::at((int)lVar16,iVar11 + dx);
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            uVar22 = 0;
            while (uVar5 != uVar22) {
              lVar1 = uVar22 * 4;
              lVar2 = uVar22 * 4;
              uVar22 = uVar22 + 1;
              if (*(int *)(lVar20 + lVar1) != *(int *)(lVar21 + lVar2)) {
                this = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_2::ArgExc::ArgExc(this,"different sample values");
                goto LAB_0010c4c8;
              }
            }
          }
        }
      }
      else if (iVar10 == 2) {
        lVar7 = *(long *)(p_Var12 + 2);
        uVar8 = *(undefined8 *)(local_80 + 2);
        lVar15 = __dynamic_cast(lVar7,&Imf_3_2::DeepImageChannel::typeinfo,
                                &Imf_3_2::TypedDeepImageChannel<float>::typeinfo,0);
        if ((lVar15 == 0) ||
           (lVar16 = __dynamic_cast(uVar8,&Imf_3_2::DeepImageChannel::typeinfo,
                                    &Imf_3_2::TypedDeepImageChannel<float>::typeinfo,0), lVar16 == 0
           )) goto LAB_0010c532;
        lVar7 = *(long *)(lVar7 + 8);
        lVar17 = Imf_3_2::DeepImageChannel::deepLevel();
        lVar18 = Imf_3_2::DeepImageChannel::deepLevel();
        for (iVar10 = *(int *)(lVar7 + 0x1c); iVar10 <= *(int *)(lVar7 + 0x24); iVar10 = iVar10 + 1)
        {
          for (iVar11 = *(int *)(lVar7 + 0x18); iVar11 <= *(int *)(lVar7 + 0x20);
              iVar11 = iVar11 + 1) {
            puVar19 = Imf_3_2::SampleCountChannel::at
                                ((SampleCountChannel *)(lVar17 + 0x58),iVar11,iVar10);
            uVar5 = *puVar19;
            puVar19 = Imf_3_2::SampleCountChannel::at
                                ((SampleCountChannel *)(lVar18 + 0x58),iVar11 + dx,iVar10 + dy);
            if (uVar5 != *puVar19) {
              this = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(this,"different pixel sample counts");
              goto LAB_0010c4c8;
            }
            lVar20 = Imf_3_2::TypedDeepImageChannel<float>::at((int)lVar15,iVar11);
            lVar21 = Imf_3_2::TypedDeepImageChannel<float>::at((int)lVar16,iVar11 + dx);
            if ((int)uVar5 < 1) {
              uVar5 = 0;
            }
            uVar22 = 0;
            while (uVar5 != uVar22) {
              fVar4 = *(float *)(lVar20 + uVar22 * 4);
              pfVar3 = (float *)(lVar21 + uVar22 * 4);
              uVar22 = uVar22 + 1;
              if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
                this = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_2::ArgExc::ArgExc(this,"different sample values");
                goto LAB_0010c4c8;
              }
            }
          }
        }
      }
      else {
        if (iVar10 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x72,
                        "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                       );
        }
        verifyPixelsAreEqual<Imath_3_2::half>
                  (*(DeepImageChannel **)(p_Var12 + 2),*(DeepImageChannel **)(local_80 + 2),dx,dy);
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    }
    p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end();
    if ((p_Var12 == p_Var13) &&
       (p_Var12 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end(), local_80 == p_Var12)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different channel lists");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different data windows");
  }
LAB_0010c4c8:
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const DeepImageLevel& level1, const DeepImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin ();
    DeepImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}